

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::Texture2DArrayView::sampleOffset
          (Texture2DArrayView *this,Sampler *sampler,float s,float t,float r,float lod,IVec2 *offset
          )

{
  WrapMode WVar1;
  undefined4 numLevels;
  Vec4 VVar2;
  
  numLevels = sampler->wrapR;
  WVar1 = sampler->wrapS;
  floorf(r + 0.5);
  VVar2 = sampleLevelArray2DOffset
                    ((ConstPixelBufferAccess *)this,numLevels,(Sampler *)(ulong)WVar1,s,t,lod,
                     (IVec3 *)offset);
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 Texture2DArrayView::sampleOffset (const Sampler& sampler, float s, float t, float r, float lod, const IVec2& offset) const
{
	return sampleLevelArray2DOffset(m_levels, m_numLevels, sampler, s, t, lod, IVec3(offset.x(), offset.y(), selectLayer(r)));
}